

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

void convert_error(quicly_stream_t *stream,int err)

{
  int iVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0) {
    __assert_fail("err != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/streambuf.c"
                  ,0x1d,"void convert_error(quicly_stream_t *, int)");
  }
  if ((in_ESI & 0xffff0000) == 0x30000) {
    quicly_is_client((quicly_conn_t *)*in_RDI);
    iVar1 = quicly_stream_has_send_side
                      (in_stack_ffffffffffffffe0,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if ((iVar1 != 0) &&
       (iVar1 = quicly_sendstate_is_open((quicly_sendstate_t *)(in_RDI + 3)), iVar1 != 0)) {
      quicly_reset_stream((quicly_stream_t *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
    }
    quicly_is_client((quicly_conn_t *)*in_RDI);
    iVar1 = quicly_stream_has_receive_side
                      (in_stack_ffffffffffffffe0,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (iVar1 != 0) {
      quicly_request_stop((quicly_stream_t *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
    }
  }
  else {
    uVar2 = in_ESI;
    if ((in_ESI & 0xffff0000) != 0x20000) {
      uVar2 = 0x20001;
    }
    quicly_close((quicly_conn_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (int)((ulong)*in_RDI >> 0x20),(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  }
  return;
}

Assistant:

static void convert_error(quicly_stream_t *stream, int err)
{
    assert(err != 0);
    if (QUICLY_ERROR_IS_QUIC_APPLICATION(err)) {
        if (quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id) &&
            quicly_sendstate_is_open(&stream->sendstate))
            quicly_reset_stream(stream, err);
        if (quicly_stream_has_receive_side(quicly_is_client(stream->conn), stream->stream_id))
            quicly_request_stop(stream, err);
    } else {
        quicly_close(stream->conn, QUICLY_ERROR_IS_QUIC_TRANSPORT(err) ? err : QUICLY_TRANSPORT_ERROR_INTERNAL, NULL);
    }
}